

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O3

void cave_illuminate(chunk *c,_Bool daytime)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  loc lVar4;
  loc lVar5;
  square *psVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  long lVar10;
  bool bVar11;
  
  wVar9 = c->height;
  if (L'\0' < wVar9) {
    wVar7 = c->width;
    wVar8 = L'\0';
    do {
      if (L'\0' < wVar7) {
        wVar9 = L'\0';
        do {
          lVar4 = (loc)loc(wVar9,wVar8);
          lVar10 = 0;
          bVar11 = false;
          do {
            lVar5 = (loc)loc_sum((loc_conflict)lVar4,(loc_conflict)ddgrid_ddd[lVar10]);
            _Var3 = square_in_bounds_fully((chunk_conflict *)c,lVar5);
            if (_Var3) {
              _Var3 = square_isfloor((chunk_conflict *)c,lVar5);
              if (!_Var3) {
                _Var3 = square_isstairs((chunk_conflict *)c,lVar5);
                if (!_Var3) goto LAB_0012771a;
              }
              bVar11 = true;
            }
LAB_0012771a:
            lVar10 = lVar10 + 1;
          } while (lVar10 != 9);
          if (daytime) {
LAB_00127782:
            psVar6 = square((chunk_conflict *)c,lVar4);
            flag_on_dbg(psVar6->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
            if (bVar11) {
              square_memorize((chunk_conflict *)c,lVar4);
            }
          }
          else {
            _Var3 = square_isfloor((chunk_conflict *)c,lVar4);
            if (!_Var3) goto LAB_00127782;
            _Var3 = square_isbright((chunk_conflict *)c,lVar4);
            if (!_Var3) {
              psVar6 = square((chunk_conflict *)c,lVar4);
              flag_off(psVar6->info,3,2);
              _Var3 = square_isfloor((chunk_conflict *)c,lVar4);
              if (_Var3) {
                square_forget((chunk_conflict *)c,lVar4);
              }
            }
          }
          wVar9 = wVar9 + L'\x01';
          wVar7 = c->width;
        } while (wVar9 < wVar7);
        wVar9 = c->height;
      }
      wVar8 = wVar8 + L'\x01';
    } while (wVar8 < wVar9);
    if (L'\0' < wVar9) {
      wVar7 = c->width;
      wVar8 = L'\0';
      do {
        if (L'\0' < wVar7) {
          wVar9 = L'\0';
          do {
            lVar4 = (loc)loc(wVar9,wVar8);
            _Var3 = square_isshop((chunk_conflict *)c,lVar4);
            if (_Var3) {
              lVar10 = 0;
              do {
                lVar5 = (loc)loc_sum((loc_conflict)lVar4,(loc_conflict)ddgrid_ddd[lVar10]);
                psVar6 = square((chunk_conflict *)c,lVar5);
                flag_on_dbg(psVar6->info,3,2,"square(c, a_grid)->info","SQUARE_GLOW");
                square_memorize((chunk_conflict *)c,lVar5);
                lVar10 = lVar10 + 1;
              } while (lVar10 != 8);
            }
            wVar9 = wVar9 + L'\x01';
            wVar7 = c->width;
          } while (wVar9 < wVar7);
          wVar9 = c->height;
        }
        wVar8 = wVar8 + L'\x01';
      } while (wVar8 < wVar9);
    }
  }
  ppVar2 = player->upkeep;
  uVar1._0_4_ = ppVar2->update;
  uVar1._4_4_ = ppVar2->redraw;
  ppVar2->update = (int)(uVar1 | 0xc1000000000060);
  ppVar2->redraw = (int)((uVar1 | 0xc1000000000060) >> 0x20);
  return;
}

Assistant:

void cave_illuminate(struct chunk *c, bool daytime)
{
	int y, x, i;

	/* Apply light or darkness */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			int d;
			bool light = false;
			struct loc grid = loc(x, y);
			
			/* Skip grids with no surrounding floors or stairs */
			for (d = 0; d < 9; d++) {
				/* Extract adjacent (legal) location */
				struct loc a_grid = loc_sum(grid, ddgrid_ddd[d]);

				/* Paranoia */
				if (!square_in_bounds_fully(c, a_grid)) continue;

				/* Test */
				if (square_isfloor(c, a_grid) || square_isstairs(c, a_grid))
					light = true;
			}

			/* Only interesting grids at night */
			if (daytime || !square_isfloor(c, grid)) {
				sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
				if(light) square_memorize(c, grid);
			} else if (!square_isbright(c, grid)) {
				sqinfo_off(square(c, grid)->info, SQUARE_GLOW);
				/* Hack -- like cave_unlight(), forget "boring" grids */
				if (square_isfloor(c, grid))
					square_forget(c, grid);
			}
		}
	}
			
			
	/* Light shop doorways */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			if (!square_isshop(c, grid))
				continue;
			for (i = 0; i < 8; i++) {
				struct loc a_grid = loc_sum(grid, ddgrid_ddd[i]);
				sqinfo_on(square(c, a_grid)->info, SQUARE_GLOW);
				square_memorize(c, a_grid);
			}
		}
	}


	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);
}